

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc.c
# Opt level: O1

void free(void *__ptr)

{
  ulong uVar1;
  ulong uVar2;
  mchunkptr pmVar3;
  bool bVar4;
  int iVar5;
  undefined8 in_RAX;
  malloc_tree_chunk **ppmVar6;
  malloc_tree_chunk *pmVar7;
  mstate pmVar8;
  byte bVar9;
  uint uVar10;
  mstate pmVar11;
  tchunkptr TP;
  mstate pmVar12;
  uint uVar13;
  long lVar14;
  malloc_tree_chunk *pmVar15;
  char *pcVar16;
  mstate pmVar17;
  ulong uVar18;
  int local_24;
  
  iVar5 = _gm_.mutex;
  if (__ptr == (void *)0x0) {
    return;
  }
  pmVar12 = (mstate)((long)__ptr - 0x10);
  if (((byte)_gm_.mflags & 2) != 0) {
    uVar13 = 1;
    LOCK();
    _gm_.mutex = 1;
    UNLOCK();
    if (iVar5 != 0) {
      while (_gm_.mutex != 0) {
        if ((uVar13 & 0x3f) == 0) {
          sched_yield();
        }
        uVar13 = uVar13 + 1;
      }
      LOCK();
      _gm_.mutex = 1;
      UNLOCK();
    }
  }
  if ((pmVar12 < _gm_.least_addr) || (uVar1 = *(ulong *)((long)__ptr + -8), ((uint)uVar1 & 3) == 1))
  goto LAB_00105bf2;
  uVar18 = uVar1 & 0xfffffffffffffff8;
  pmVar11 = (mstate)((long)pmVar12->smallbins + (uVar18 - 0x48));
  if ((uVar1 & 1) == 0) {
    uVar2 = *(ulong *)pmVar12;
    if ((uVar1 & 2) == 0) {
      uVar18 = uVar18 + uVar2 + 0x20;
      iVar5 = munmap((void *)((long)pmVar12 - uVar2),uVar18);
      local_24 = 2;
      if (iVar5 == 0) {
        _gm_.footprint = _gm_.footprint - uVar18;
      }
    }
    else {
      pmVar12 = (mstate)((long)pmVar12 - uVar2);
      uVar18 = uVar18 + uVar2;
      if (_gm_.least_addr <= pmVar12) {
        if (pmVar12 == (mstate)_gm_.dv) {
          if ((~(uint)pmVar11->dvsize & 3) == 0) {
            _gm_.dvsize = uVar18;
            pmVar11->dvsize = pmVar11->dvsize & 0xfffffffffffffffe;
            pmVar12->dvsize = uVar18 | 1;
            *(ulong *)pmVar11 = uVar18;
            local_24 = 2;
            goto LAB_00105641;
          }
        }
        else {
          if (0xff < uVar2) {
            pmVar8 = (mstate)pmVar12->least_addr;
            pmVar7 = (malloc_tree_chunk *)pmVar12->trim_check;
            if (pmVar8 == pmVar12) {
              pmVar8 = (mstate)pmVar12->top;
              if (pmVar8 != (mstate)0x0) {
                ppmVar6 = (malloc_tree_chunk **)&pmVar12->top;
LAB_001056ac:
                do {
                  if (pmVar8->top == (mchunkptr)0x0) {
                    if ((malloc_tree_chunk *)pmVar8->dv == (malloc_tree_chunk *)0x0)
                    goto code_r0x001056c0;
                    ppmVar6 = (malloc_tree_chunk **)&pmVar8->dv;
                  }
                  else {
                    ppmVar6 = (malloc_tree_chunk **)&pmVar8->top;
                  }
                  pmVar8 = (mstate)*ppmVar6;
                } while( true );
              }
              pmVar8 = (mstate)pmVar12->dv;
              if (pmVar8 != (mstate)0x0) {
                ppmVar6 = (malloc_tree_chunk **)&pmVar12->dv;
                goto LAB_001056ac;
              }
              pmVar8 = (mstate)0x0;
            }
            else {
              pmVar15 = (malloc_tree_chunk *)pmVar12->topsize;
              if (((pmVar15 < _gm_.least_addr) || ((mstate)pmVar15->bk != pmVar12)) ||
                 ((mstate)pmVar8->topsize != pmVar12)) goto LAB_00105bf2;
              pmVar15->bk = (malloc_tree_chunk *)pmVar8;
              pmVar8->topsize = (size_t)pmVar15;
            }
            goto LAB_001056d0;
          }
          pmVar7 = (malloc_tree_chunk *)pmVar12->topsize;
          pmVar15 = (malloc_tree_chunk *)pmVar12->least_addr;
          if ((pmVar7 != (malloc_tree_chunk *)(_gm_.smallbins + (uVar2 >> 3) * 2)) &&
             ((pmVar7 < _gm_.least_addr || ((mstate)pmVar7->bk != pmVar12)))) goto LAB_00105bf2;
          if (pmVar15 == pmVar7) {
            free_cold_1();
          }
          else {
            if ((pmVar15 != (malloc_tree_chunk *)(_gm_.smallbins + (uVar2 >> 3) * 2)) &&
               ((pmVar15 < _gm_.least_addr || ((mstate)pmVar15->fd != pmVar12)))) goto LAB_00105bf2;
            pmVar7->bk = pmVar15;
            pmVar15->fd = pmVar7;
          }
        }
        bVar4 = true;
        local_24 = 0;
        goto LAB_00105782;
      }
      local_24 = 5;
    }
LAB_00105641:
    bVar4 = false;
    goto LAB_00105782;
  }
LAB_0010578a:
  local_24 = 0;
  if ((pmVar12 < pmVar11) && (uVar1 = pmVar11->dvsize, (uVar1 & 1) != 0)) {
    if ((uVar1 & 2) != 0) {
      pmVar11->dvsize = uVar1 & 0xfffffffffffffffe;
      pmVar12->dvsize = uVar18 | 1;
      *(ulong *)((long)pmVar12->smallbins + (uVar18 - 0x48)) = uVar18;
      goto LAB_001059df;
    }
    if (pmVar11 == (mstate)_gm_.top) {
      free_cold_2();
      local_24 = (int)((ulong)in_RAX >> 0x20);
      goto LAB_00105b99;
    }
    if (pmVar11 != (mstate)_gm_.dv) {
      if (0xff < uVar1) {
        pmVar8 = (mstate)pmVar11->least_addr;
        pmVar7 = (malloc_tree_chunk *)pmVar11->trim_check;
        if (pmVar8 == pmVar11) {
          pmVar8 = (mstate)pmVar11->top;
          if (pmVar8 != (mstate)0x0) {
            ppmVar6 = (malloc_tree_chunk **)&pmVar11->top;
LAB_001058da:
            do {
              if (pmVar8->top == (mchunkptr)0x0) {
                if ((malloc_tree_chunk *)pmVar8->dv == (malloc_tree_chunk *)0x0)
                goto code_r0x001058ee;
                ppmVar6 = (malloc_tree_chunk **)&pmVar8->dv;
              }
              else {
                ppmVar6 = (malloc_tree_chunk **)&pmVar8->top;
              }
              pmVar8 = (mstate)*ppmVar6;
            } while( true );
          }
          pmVar8 = (mstate)pmVar11->dv;
          if (pmVar8 != (mstate)0x0) {
            ppmVar6 = (malloc_tree_chunk **)&pmVar11->dv;
            goto LAB_001058da;
          }
          pmVar8 = (mstate)0x0;
        }
        else {
          pmVar15 = (malloc_tree_chunk *)pmVar11->topsize;
          if (((pmVar15 < _gm_.least_addr) || ((mstate)pmVar15->bk != pmVar11)) ||
             ((mstate)pmVar8->topsize != pmVar11)) goto LAB_00105bf2;
          pmVar15->bk = (malloc_tree_chunk *)pmVar8;
          pmVar8->topsize = (size_t)pmVar15;
        }
        goto LAB_00105902;
      }
      pmVar7 = (malloc_tree_chunk *)pmVar11->topsize;
      pmVar15 = (malloc_tree_chunk *)pmVar11->least_addr;
      if ((pmVar7 != (malloc_tree_chunk *)(_gm_.smallbins + (uVar1 >> 3) * 2)) &&
         ((pmVar7 < _gm_.least_addr || ((mstate)pmVar7->bk != pmVar11)))) goto LAB_00105bf2;
      if (pmVar15 == pmVar7) {
        bVar9 = (byte)(uVar1 >> 3) & 0x1f;
        _gm_.smallmap = _gm_.smallmap & (-2 << bVar9 | 0xfffffffeU >> 0x20 - bVar9);
      }
      else {
        if ((pmVar15 != (malloc_tree_chunk *)(_gm_.smallbins + (uVar1 >> 3) * 2)) &&
           ((pmVar15 < _gm_.least_addr || ((mstate)pmVar15->fd != pmVar11)))) goto LAB_00105bf2;
        pmVar7->bk = pmVar15;
        pmVar15->fd = pmVar7;
      }
      goto LAB_001059a6;
    }
    free_cold_3();
LAB_00105a78:
    local_24 = 2;
  }
LAB_00105b99:
  if (local_24 == 2) {
    if (((byte)_gm_.mflags & 2) != 0) {
      _gm_.mutex = 0;
    }
    return;
  }
LAB_00105bf2:
  abort();
code_r0x001056c0:
  if (ppmVar6 < _gm_.least_addr) goto LAB_00105bf2;
  *ppmVar6 = (malloc_tree_chunk *)0x0;
LAB_001056d0:
  iVar5 = 0;
  bVar4 = true;
  local_24 = 0;
  if (pmVar7 != (malloc_tree_chunk *)0x0) {
    uVar13 = (uint)pmVar12->release_checks;
    local_24 = iVar5;
    if (pmVar12 == (mstate)_gm_.treebins[uVar13]) {
      _gm_.treebins[uVar13] = (tbinptr)pmVar8;
      if (pmVar8 == (mstate)0x0) {
        bVar9 = (byte)uVar13 & 0x1f;
        _gm_.treemap = _gm_.treemap & (-2 << bVar9 | 0xfffffffeU >> 0x20 - bVar9);
        goto LAB_0010572a;
      }
    }
    else {
      if (pmVar7 < _gm_.least_addr) goto LAB_00105bf2;
      if ((mstate)pmVar7->child[0] == pmVar12) {
        pmVar7->child[0] = (malloc_tree_chunk *)pmVar8;
      }
      else {
        pmVar7->child[1] = (malloc_tree_chunk *)pmVar8;
      }
LAB_0010572a:
      if (pmVar8 == (mstate)0x0) goto LAB_00105782;
    }
    pcVar16 = _gm_.least_addr;
    if (pmVar8 < _gm_.least_addr) goto LAB_00105bf2;
    pmVar8->trim_check = (size_t)pmVar7;
    pmVar7 = (malloc_tree_chunk *)pmVar12->dv;
    if (pmVar7 != (malloc_tree_chunk *)0x0) {
      if (pmVar7 < pcVar16) goto LAB_00105bf2;
      pmVar8->dv = (mchunkptr)pmVar7;
      pmVar7->parent = (malloc_tree_chunk *)pmVar8;
    }
    pmVar3 = pmVar12->top;
    if (pmVar3 != (mchunkptr)0x0) {
      if (pmVar3 < pcVar16) goto LAB_00105bf2;
      pmVar8->top = pmVar3;
      pmVar3[1].fd = (malloc_chunk *)pmVar8;
    }
  }
LAB_00105782:
  if (bVar4) goto LAB_0010578a;
  goto LAB_00105b99;
code_r0x001058ee:
  if (ppmVar6 < _gm_.least_addr) goto LAB_00105bf2;
  *ppmVar6 = (malloc_tree_chunk *)0x0;
LAB_00105902:
  if (pmVar7 != (malloc_tree_chunk *)0x0) {
    uVar13 = (uint)pmVar11->release_checks;
    if (pmVar11 == (mstate)_gm_.treebins[uVar13]) {
      _gm_.treebins[uVar13] = (tbinptr)pmVar8;
      if (pmVar8 == (mstate)0x0) {
        bVar9 = (byte)uVar13 & 0x1f;
        _gm_.treemap = _gm_.treemap & (-2 << bVar9 | 0xfffffffeU >> 0x20 - bVar9);
        goto LAB_00105959;
      }
    }
    else {
      if (pmVar7 < _gm_.least_addr) goto LAB_00105bf2;
      if ((mstate)pmVar7->child[0] == pmVar11) {
        pmVar7->child[0] = (malloc_tree_chunk *)pmVar8;
      }
      else {
        pmVar7->child[1] = (malloc_tree_chunk *)pmVar8;
      }
LAB_00105959:
      if (pmVar8 == (mstate)0x0) goto LAB_001059a6;
    }
    pcVar16 = _gm_.least_addr;
    if (pmVar8 < _gm_.least_addr) goto LAB_00105bf2;
    pmVar8->trim_check = (size_t)pmVar7;
    pmVar7 = (malloc_tree_chunk *)pmVar11->dv;
    if (pmVar7 != (malloc_tree_chunk *)0x0) {
      if (pmVar7 < pcVar16) goto LAB_00105bf2;
      pmVar8->dv = (mchunkptr)pmVar7;
      pmVar7->parent = (malloc_tree_chunk *)pmVar8;
    }
    pmVar3 = pmVar11->top;
    if (pmVar3 != (mchunkptr)0x0) {
      if (pmVar3 < pcVar16) goto LAB_00105bf2;
      pmVar8->top = pmVar3;
      pmVar3[1].fd = (malloc_chunk *)pmVar8;
    }
  }
LAB_001059a6:
  uVar18 = (uVar1 & 0xfffffffffffffff8) + uVar18;
  pmVar12->dvsize = uVar18 | 1;
  *(ulong *)((long)pmVar12->smallbins + (uVar18 - 0x48)) = uVar18;
  if (pmVar12 == (mstate)_gm_.dv) {
    local_24 = 2;
    _gm_.dvsize = uVar18;
  }
  else {
LAB_001059df:
    if (uVar18 < 0x100) {
      uVar18 = uVar18 >> 3;
      if ((_gm_.smallmap >> ((uint)uVar18 & 0x1f) & 1) == 0) {
        _gm_.smallmap = _gm_.smallmap | 1 << ((byte)uVar18 & 0x1f);
        pmVar7 = (malloc_tree_chunk *)(_gm_.smallbins + uVar18 * 2);
      }
      else {
        pmVar7 = (malloc_tree_chunk *)_gm_.smallbins[uVar18 * 2 + 2];
        if ((malloc_tree_chunk *)_gm_.smallbins[uVar18 * 2 + 2] < _gm_.least_addr)
        goto LAB_00105bf2;
      }
      _gm_.smallbins[uVar18 * 2 + 2] = (mchunkptr)pmVar12;
      pmVar7->bk = (malloc_tree_chunk *)pmVar12;
      pmVar12->topsize = (size_t)pmVar7;
      pmVar12->least_addr = (char *)(_gm_.smallbins + uVar18 * 2);
      goto LAB_00105a78;
    }
    uVar13 = (uint)(uVar18 >> 8);
    if (uVar13 == 0) {
      uVar10 = 0;
    }
    else {
      uVar10 = 0x1f;
      if (uVar13 < 0x10000) {
        uVar10 = 0x1f;
        if (uVar13 != 0) {
          for (; uVar13 >> uVar10 == 0; uVar10 = uVar10 - 1) {
          }
        }
        uVar10 = (uint)((uVar18 >> ((ulong)(byte)(0x26 - (char)(uVar10 ^ 0x1f)) & 0x3f) & 1) != 0) +
                 (uVar10 ^ 0x1f) * 2 ^ 0x3e;
      }
    }
    pmVar7 = (malloc_tree_chunk *)(_gm_.treebins + uVar10);
    *(uint *)&pmVar12->release_checks = uVar10;
    pmVar12->dv = (mchunkptr)0x0;
    pmVar12->top = (mchunkptr)0x0;
    if ((_gm_.treemap >> (uVar10 & 0x1f) & 1) == 0) {
      _gm_.treemap = _gm_.treemap | 1 << ((byte)uVar10 & 0x1f);
      lVar14 = 0x10;
      pmVar17 = (mstate)&DAT_00000030;
      pmVar11 = pmVar12;
      pmVar15 = pmVar7;
      pmVar8 = pmVar12;
LAB_00105b77:
      pmVar15->prev_foot = (size_t)pmVar12;
      *(malloc_tree_chunk **)
       ((long)(((malloc_state *)(((malloc_state *)(pmVar17->smallbins + -9))->smallbins + -9))->
               smallbins + 0xfffffffffffffff7) +
       (long)((malloc_state *)
             (((malloc_state *)(((malloc_state *)(pmVar12->smallbins + -9))->smallbins + -9))->
              smallbins + -9))->smallbins + 0xffffffffffffffb8U) = pmVar7;
      pmVar12->least_addr = (char *)pmVar11;
      *(mstate *)((long)pmVar12->smallbins + lVar14 + -0x48) = pmVar8;
      pmVar11 = pmVar17;
    }
    else {
      pmVar11 = (mstate)pmVar7->prev_foot;
      bVar9 = 0x39 - (char)(uVar10 >> 1);
      if (uVar10 == 0x1f) {
        bVar9 = 0;
      }
      lVar14 = uVar18 << (bVar9 & 0x3f);
      do {
        if ((pmVar11->dvsize & 0xfffffffffffffff8) == uVar18) {
          if ((pmVar11 < _gm_.least_addr) ||
             (pmVar7 = (malloc_tree_chunk *)pmVar11->topsize, pmVar7 < _gm_.least_addr))
          goto LAB_00105bf2;
          pmVar7->bk = (malloc_tree_chunk *)pmVar12;
          lVar14 = 0x30;
          pmVar17 = (mstate)&DAT_00000010;
          pmVar15 = (malloc_tree_chunk *)&pmVar11->topsize;
          pmVar8 = (mstate)0x0;
          goto LAB_00105b77;
        }
        pmVar8 = *(mstate *)((long)pmVar11 + (lVar14 >> 0x3f) * -8 + 0x20);
        pmVar17 = pmVar8;
        if (pmVar8 == (mstate)0x0) {
          pcVar16 = (char *)((long)pmVar11 + (lVar14 >> 0x3f) * -8 + 0x20);
          if (pcVar16 < _gm_.least_addr) goto LAB_00105bf2;
          *(mstate *)pcVar16 = pmVar12;
          pmVar12->trim_check = (size_t)pmVar11;
          pmVar12->least_addr = (char *)pmVar12;
          pmVar12->topsize = (size_t)pmVar12;
          pmVar17 = pmVar11;
        }
        pmVar11 = pmVar17;
        lVar14 = lVar14 * 2;
      } while (pmVar8 != (mstate)0x0);
    }
    _gm_.release_checks = _gm_.release_checks - 1;
    local_24 = 2;
    if (_gm_.release_checks == 0) {
      release_unused_segments(pmVar11);
    }
  }
  goto LAB_00105b99;
}

Assistant:

void dlfree(void* mem) {
  /*
     Consolidate freed chunks with preceeding or succeeding bordering
     free chunks, if they exist, and then place in a bin.  Intermixed
     with special cases for top, dv, mmapped chunks, and usage errors.
  */

  if (mem != 0) {
    mchunkptr p  = mem2chunk(mem);
#if FOOTERS
    mstate fm = get_mstate_for(p);
    if (!ok_magic(fm)) {
      USAGE_ERROR_ACTION(fm, p);
      return;
    }
#else /* FOOTERS */
#define fm gm
#endif /* FOOTERS */
    if (!PREACTION(fm)) {
      check_inuse_chunk(fm, p);
      if (RTCHECK(ok_address(fm, p) && ok_inuse(p))) {
        size_t psize = chunksize(p);
        mchunkptr next = chunk_plus_offset(p, psize);
        if (!pinuse(p)) {
          size_t prevsize = p->prev_foot;
          if (is_mmapped(p)) {
            psize += prevsize + MMAP_FOOT_PAD;
            if (CALL_MUNMAP((char*)p - prevsize, psize) == 0)
              fm->footprint -= psize;
            goto postaction;
          }
          else {
            mchunkptr prev = chunk_minus_offset(p, prevsize);
            psize += prevsize;
            p = prev;
            if (RTCHECK(ok_address(fm, prev))) { /* consolidate backward */
              if (p != fm->dv) {
                unlink_chunk(fm, p, prevsize);
              }
              else if ((next->head & INUSE_BITS) == INUSE_BITS) {
                fm->dvsize = psize;
                set_free_with_pinuse(p, psize, next);
                goto postaction;
              }
            }
            else
              goto erroraction;
          }
        }

        if (RTCHECK(ok_next(p, next) && ok_pinuse(next))) {
          if (!cinuse(next)) {  /* consolidate forward */
            if (next == fm->top) {
              size_t tsize = fm->topsize += psize;
              fm->top = p;
              p->head = tsize | PINUSE_BIT;
              if (p == fm->dv) {
                fm->dv = 0;
                fm->dvsize = 0;
              }
              if (should_trim(fm, tsize))
                sys_trim(fm, 0);
              goto postaction;
            }
            else if (next == fm->dv) {
              size_t dsize = fm->dvsize += psize;
              fm->dv = p;
              set_size_and_pinuse_of_free_chunk(p, dsize);
              goto postaction;
            }
            else {
              size_t nsize = chunksize(next);
              psize += nsize;
              unlink_chunk(fm, next, nsize);
              set_size_and_pinuse_of_free_chunk(p, psize);
              if (p == fm->dv) {
                fm->dvsize = psize;
                goto postaction;
              }
            }
          }
          else
            set_free_with_pinuse(p, psize, next);

          if (is_small(psize)) {
            insert_small_chunk(fm, p, psize);
            check_free_chunk(fm, p);
          }
          else {
            tchunkptr tp = (tchunkptr)p;
            insert_large_chunk(fm, tp, psize);
            check_free_chunk(fm, p);
            if (--fm->release_checks == 0)
              release_unused_segments(fm);
          }
          goto postaction;
        }
      }
    erroraction:
      USAGE_ERROR_ACTION(fm, p);
    postaction:
      POSTACTION(fm);
    }
  }
#if !FOOTERS
#undef fm
#endif /* FOOTERS */
}